

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

char * path(char *s)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  char *local_50;
  char *local_48;
  char *curdir;
  char *prevdir;
  char *t;
  char *file;
  char *endpart;
  char *curpart;
  char *s_local;
  
  endpart = s;
  while( true ) {
    pcVar1 = strchr(endpart,0x26);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    if (*endpart == '<') {
      pcVar2 = strrchr(endpart,0x3e);
      if (pcVar2 == (char *)0x0) {
        return s;
      }
      endpart = pcVar2 + 1;
    }
    prevdir = endpart;
    while (pcVar2 = strpbrk(prevdir,"/\\"), pcVar2 != (char *)0x0) {
      prevdir = pcVar2 + 1;
      *pcVar2 = '/';
    }
    local_48 = endpart;
    while( true ) {
      if (*local_48 == '/') {
        local_50 = local_48 + 1;
      }
      else {
        local_50 = local_48;
      }
      local_48 = strchr(local_50,0x2f);
      if (local_48 == (char *)0x0) break;
      if ((local_50 + 1 == local_48) && (*local_50 == '.')) {
        sVar3 = strlen(local_48 + 1);
        memmove(local_50,local_48 + 1,sVar3 + 1);
        local_48 = local_50;
      }
      else if (((local_48[1] == '.') && ((local_48[2] == '.' && (local_48[3] == '/')))) &&
              ((local_50 + 2 != local_48 || ((*local_50 != '.' || (local_50[1] != '.')))))) {
        sVar3 = strlen(local_48 + 4);
        memmove(local_50,local_48 + 4,sVar3 + 1);
        local_48 = local_50;
      }
    }
    if (pcVar1 == (char *)0x0) break;
    *pcVar1 = '&';
    endpart = pcVar1 + 1;
  }
  return s;
}

Assistant:

char *path(char *s)
{
    for(char *curpart = s;;)
    {
        char *endpart = strchr(curpart, '&');
        if(endpart) *endpart = '\0';
        if(curpart[0]=='<')
        {
            char *file = strrchr(curpart, '>');
            if(!file) return s;
            curpart = file+1;
        }
        for(char *t = curpart; (t = strpbrk(t, "/\\")); *t++ = PATHDIV);
        for(char *prevdir = NULL, *curdir = curpart;;)
        {
            prevdir = curdir[0]==PATHDIV ? curdir+1 : curdir;
            curdir = strchr(prevdir, PATHDIV);
            if(!curdir) break;
            if(prevdir+1==curdir && prevdir[0]=='.')
            {
                memmove(prevdir, curdir+1, strlen(curdir+1)+1);
                curdir = prevdir;
            }
            else if(curdir[1]=='.' && curdir[2]=='.' && curdir[3]==PATHDIV)
            {
                if(prevdir+2==curdir && prevdir[0]=='.' && prevdir[1]=='.') continue;
                memmove(prevdir, curdir+4, strlen(curdir+4)+1);
                curdir = prevdir;
            }
        }
        if(endpart)
        {
            *endpart = '&';
            curpart = endpart+1;
        }
        else break;
    }
    return s;
}